

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O3

CURLcode easysrc_addf(curl_slist **plist,char *fmt,...)

{
  CURLcode CVar1;
  char *line;
  va_list ap;
  
  line = (char *)curl_mvaprintf(fmt);
  if (line == (char *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    CVar1 = easysrc_add(plist,line);
    curl_free(line);
  }
  return CVar1;
}

Assistant:

CURLcode easysrc_addf(struct curl_slist **plist, const char *fmt, ...)
{
  CURLcode ret;
  char *bufp;
  va_list ap;
  va_start(ap, fmt);
  bufp = curlx_mvaprintf(fmt, ap);
  va_end(ap);
  if(! bufp) {
    ret = CURLE_OUT_OF_MEMORY;
  }
  else {
    ret = easysrc_add(plist, bufp);
    curl_free(bufp);
  }
  return ret;
}